

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<char_const(&)[6]>::operator!=
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[6]> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  string local_b8;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  bool local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b8._M_dataplus._M_p = rhs->data_;
  local_b8._M_string_length = rhs->size_;
  bVar1 = nonstd::sv_lite::operator==
                    (*(char **)this,(basic_string_view<char,_std::char_traits<char>_> *)&local_b8);
  this_00 = *(lest **)this;
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"!=","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_d8,local_d8 + local_d0);
  to_string<char[6],nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_b8,this_00,(char (*) [6])local_50,(string *)rhs,in_R8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_b8._M_dataplus._M_p,
             local_b8._M_dataplus._M_p + local_b8._M_string_length);
  local_78 = !bVar1;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_98,local_98 + local_90);
  __return_storage_ptr__->passed = local_78;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70,local_70 + local_68);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }